

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaVector<VmaBlockMetadata_TLSF::Block_*,_VmaStlAllocator<VmaBlockMetadata_TLSF::Block_*>_>::
~VmaVector(VmaVector<VmaBlockMetadata_TLSF::Block_*,_VmaStlAllocator<VmaBlockMetadata_TLSF::Block_*>_>
           *this)

{
  void *in_RDI;
  
  VmaFree((VkAllocationCallbacks *)this,in_RDI);
  return;
}

Assistant:

~VmaVector() { VmaFree(m_Allocator.m_pCallbacks, m_pArray); }